

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O0

int multifast_replace(AC_TRIE_t *thiz,AC_TEXT_t *instr,MF_REPLACE_MODE_t mode,
                     MF_REPLACE_CALBACK_f callback,void *param)

{
  size_t to_position;
  MF_REPLACEMENT_DATA_t *rd_00;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  size_t backlog_pos;
  size_t position_r;
  MF_REPLACEMENT_DATA_t *rd;
  mf_replacement_nominee nom;
  ACT_NODE_t *next;
  ACT_NODE_t *current;
  ulong local_60;
  MF_REPLACEMENT_DATA_t *in_stack_ffffffffffffffb0;
  MF_REPLACEMENT_DATA_t *local_38;
  int local_4;
  
  to_position = in_RDI + 0x40;
  local_60 = 0;
  if (*(short *)(in_RDI + 0x10) == 0) {
    if (*(int *)(in_RDI + 0x60) == 0) {
      local_4 = -2;
    }
    else {
      *(undefined8 *)(in_RDI + 0x90) = in_RCX;
      *(undefined8 *)(in_RDI + 0x98) = in_R8;
      *(undefined4 *)(in_RDI + 0x88) = in_EDX;
      *(long **)(in_RDI + 0x30) = in_RSI;
      local_38 = *(MF_REPLACEMENT_DATA_t **)(in_RDI + 0x20);
      while (local_60 < (ulong)in_RSI[1]) {
        rd_00 = (MF_REPLACEMENT_DATA_t *)
                node_find_next_bs((ACT_NODE_t *)local_38,*(AC_ALPHABET_t *)(*in_RSI + local_60));
        if (rd_00 == (MF_REPLACEMENT_DATA_t *)0x0) {
          if ((local_38->backlog).astring == (AC_ALPHABET_t *)0x0) {
            local_60 = local_60 + 1;
          }
          else {
            local_38 = (MF_REPLACEMENT_DATA_t *)(local_38->backlog).astring;
          }
        }
        else {
          local_60 = local_60 + 1;
          local_38 = rd_00;
        }
        if ((*(int *)((long)&(local_38->buffer).astring + 4) != 0) &&
           (rd_00 != (MF_REPLACEMENT_DATA_t *)0x0)) {
          in_stack_ffffffffffffffb0 = *(MF_REPLACEMENT_DATA_t **)&local_38->replace_mode;
          mf_repdata_booknominee
                    (rd_00,(mf_replacement_nominee *)(*(long *)(in_RDI + 0x28) + local_60));
        }
      }
      mf_repdata_do_replace(in_stack_ffffffffffffffb0,to_position);
      mf_repdata_savetobacklog(in_stack_ffffffffffffffb0,to_position);
      *(MF_REPLACEMENT_DATA_t **)(in_RDI + 0x20) = local_38;
      *(ulong *)(in_RDI + 0x28) = local_60 + *(long *)(in_RDI + 0x28);
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int multifast_replace (AC_TRIE_t *thiz, AC_TEXT_t *instr, 
        MF_REPLACE_MODE_t mode, MF_REPLACE_CALBACK_f callback, void *param)
{
    ACT_NODE_t *current;
    ACT_NODE_t *next;
    struct mf_replacement_nominee nom;
    MF_REPLACEMENT_DATA_t *rd = &thiz->repdata;
    
    size_t position_r = 0;  /* Relative current position in the input string */
    size_t backlog_pos = 0; /* Relative backlog position in the input string */
    
    if (thiz->trie_open)
        return -1; /* _finalize() must be called first */
    
    if (!rd->has_replacement)
        return -2; /* Trie doesn't have any to-be-replaced pattern */
    
    rd->cbf = callback;
    rd->user = param;
    rd->replace_mode = mode;
    
    thiz->text = instr; /* Save the input string in a helper variable 
                         * for convenience */
    
    current = thiz->last_node;
    
    /* Main replace loop: 
     * Find patterns and bookmark them 
     */
    while (position_r < instr->length)
    {
        if (!(next = node_find_next_bs(current, instr->astring[position_r])))
        {
            /* Failed to follow a pattern */
            if(current->failure_node)
                current = current->failure_node;
            else
                position_r++;
        }
        else
        {
            current = next;
            position_r++;
        }
        
        if (current->final && next)
        {
            /* Bookmark nominee patterns for replacement */
            nom.pattern = current->to_be_replaced;
            nom.position = thiz->base_position + position_r;
            
            mf_repdata_booknominee (rd, &nom);
        }
    }
    
    /* 
     * At the end of input chunk, if the tail of the chunk is a prefix of a
     * pattern, then we must keep it in the backlog buffer and wait for the 
     * next chunk to decide about it. */
    
    backlog_pos = thiz->base_position + instr->length - current->depth;
    
    /* Now replace the patterns up to the backlog_pos point */
    mf_repdata_do_replace (rd, backlog_pos);
    
    /* Save the remaining to the backlog buffer */
    mf_repdata_savetobacklog (rd, backlog_pos);
    
    /* Save status variables */
    thiz->last_node = current;
    thiz->base_position += position_r;
    
    return 0;
}